

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

S1ChordAngle __thiscall S2Cell::GetMaxDistance(S2Cell *this,S2Point *a,S2Point *b)

{
  S1ChordAngle SVar1;
  S1ChordAngle SVar2;
  S2Point local_58;
  S2Point local_38;
  
  SVar1 = GetMaxDistance(this,a);
  SVar2 = GetMaxDistance(this,b);
  if (SVar2.length2_ <= SVar1.length2_) {
    SVar2 = SVar1;
  }
  SVar1 = S1ChordAngle::Right();
  if (SVar1.length2_ < SVar2.length2_) {
    SVar2 = S1ChordAngle::Straight();
    local_38.c_[2] = -a->c_[2];
    local_38.c_[0] = -a->c_[0];
    local_38.c_[1] = -a->c_[1];
    local_58.c_[2] = -b->c_[2];
    local_58.c_[0] = -b->c_[0];
    local_58.c_[1] = -b->c_[1];
    SVar1 = GetDistance(this,&local_38,&local_58);
    SVar2 = operator-(SVar2,SVar1);
  }
  return (S1ChordAngle)SVar2.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetMaxDistance(const S2Point& a, const S2Point& b) const {
  // If the maximum distance from both endpoints to the cell is less than Pi/2
  // then the maximum distance from the edge to the cell is the maximum of the
  // two endpoint distances.
  S1ChordAngle max_dist = max(GetMaxDistance(a), GetMaxDistance(b));
  if (max_dist <= S1ChordAngle::Right()) {
    return max_dist;
  }

  return S1ChordAngle::Straight() - GetDistance(-a, -b);
}